

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLUCS4Transcoder.cpp
# Opt level: O2

XMLSize_t __thiscall
xercesc_4_0::XMLUCS4Transcoder::transcodeTo
          (XMLUCS4Transcoder *this,XMLCh *srcData,XMLSize_t srcCount,XMLByte *toFill,
          XMLSize_t maxBytes,XMLSize_t *charsEaten,UnRepOpts param_6)

{
  uint *puVar1;
  bool bVar2;
  XMLCh XVar3;
  XMLCh XVar4;
  XMLSize_t XVar5;
  TranscodingException *this_00;
  uint uVar6;
  XMLCh *pXVar7;
  UCS4Ch tmpCh;
  
  bVar2 = this->fSwapped;
  XVar5 = 0;
  pXVar7 = srcData;
  while ((puVar1 = (uint *)(toFill + XVar5), puVar1 < toFill + (maxBytes & 0xfffffffffffffffc) &&
         (pXVar7 < srcData + srcCount))) {
    XVar3 = *pXVar7;
    if ((XVar3 & 0xfc00U) == 0xd800) {
      if (pXVar7 + 1 == srcData + srcCount) break;
      XVar4 = pXVar7[1];
      if ((XVar4 & 0xfc00U) != 0xdc00) {
        this_00 = (TranscodingException *)__cxa_allocate_exception(0x30);
        TranscodingException::TranscodingException
                  (this_00,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLUCS4Transcoder.cpp"
                   ,0xca,Trans_BadTrailingSurrogate,(this->super_XMLTranscoder).fMemoryManager);
        __cxa_throw(this_00,&TranscodingException::typeinfo,XMLException::~XMLException);
      }
      pXVar7 = pXVar7 + 2;
      *puVar1 = (uint)(ushort)XVar3 * 0x400 + (uint)(ushort)XVar4 + 0xfca02400;
    }
    else {
      uVar6 = ((ushort)XVar3 & 0xff00) << 8 | (uint)(ushort)XVar3 << 0x18;
      if ((bVar2 & 1U) == 0) {
        uVar6 = (uint)(ushort)XVar3;
      }
      *puVar1 = uVar6;
      pXVar7 = pXVar7 + 1;
    }
    XVar5 = XVar5 + 4;
  }
  *charsEaten = (long)pXVar7 - (long)srcData >> 1;
  return XVar5;
}

Assistant:

XMLSize_t
XMLUCS4Transcoder::transcodeTo( const   XMLCh* const    srcData
                                , const XMLSize_t       srcCount
                                ,       XMLByte* const  toFill
                                , const XMLSize_t       maxBytes
                                ,       XMLSize_t&      charsEaten
                                , const UnRepOpts)
{
    //
    //  Get pointers to the start and end of the source buffer, which
    //  is in terms of XMLCh chars.
    //
    const XMLCh*  srcPtr = srcData;
    const XMLCh*  srcEnd = srcData + srcCount;

    //
    //  Get pointers to the start and end of the target buffer, in terms
    //  of UCS-4 chars.
    //
    UCS4Ch*   outPtr = reinterpret_cast<UCS4Ch*>(toFill);
    UCS4Ch*   outEnd = outPtr + (maxBytes / sizeof(UCS4Ch));

    //
    //  Now loop until we either run out of source characters or we
    //  fill up our output buffer.
    //
    XMLCh trailCh;
    while ((outPtr < outEnd) && (srcPtr < srcEnd))
    {
        //
        //  Get out an XMLCh char from the source. Don't bump up the
        //  pointer yet, since it might be a leading for which we don't
        //  have the trailing.
        //
        const XMLCh curCh = *srcPtr;

        //
        //  If its a leading char of a surrogate pair handle it one way,
        //  else just cast it over into the target.
        //
        if ((curCh >= 0xD800) && (curCh <= 0xDBFF))
        {
            //
            //  Ok, we have to have another source char available or we
            //  just give up without eating the leading char.
            //
            if (srcPtr + 1 == srcEnd)
                break;

            //
            //  We have the trailing char, so eat the first char and the
            //  trailing char from the source.
            //
            srcPtr++;
            trailCh = *srcPtr++;

            //
            //  Then make sure its a legal trailing char. If not, throw
            //  an exception.
            //
            if ( !( (trailCh >= 0xDC00) && (trailCh <= 0xDFFF) ) )
                ThrowXMLwithMemMgr(TranscodingException, XMLExcepts::Trans_BadTrailingSurrogate, getMemoryManager());

            // And now combine the two into a single output char
            const XMLInt32 SURROGATE_OFFSET = 0x10000 - (0xD800 << 10) - 0xDC00;
            *outPtr++ = (curCh << 10) + trailCh + SURROGATE_OFFSET;
        }
         else
        {
            //
            //  Its just a char, so we can take it as is. If we need to
            //  swap it, then swap it. Because of flakey compilers, use
            //  a temp first.
            //
            const UCS4Ch tmpCh = UCS4Ch(curCh);
            if (fSwapped)
                *outPtr++ = BitOps::swapBytes(tmpCh);
            else
                *outPtr++ = tmpCh;

            // Bump the source pointer
            srcPtr++;
        }
    }

    // Set the chars we ate from the source
    charsEaten = srcPtr - srcData;

    // Return the bytes we wrote to the output
    return ((XMLByte*)outPtr) - toFill;
}